

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void add_history(CHAR_DATA *ch,CHAR_DATA *victim,char *string)

{
  char *pcVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  char *strtime;
  char obuf [4608];
  char buf [4608];
  char *pstr;
  char local_2418 [16];
  char *in_stack_ffffffffffffdbf8;
  char local_1218 [4608];
  char *local_18;
  long local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar1 = ctime(&current_time);
  chomp(pcVar1);
  if (*(long *)(*(long *)(local_10 + 0xc0) + 0xb18) == 0) {
    strcpy(local_1218,"");
  }
  else {
    sprintf(local_1218,"%s",*(undefined8 *)(*(long *)(local_10 + 0xc0) + 0xb18));
  }
  if (local_8 == 0) {
    pstr = "AUTO";
  }
  else {
    pstr = *(char **)(local_8 + 0xe8);
  }
  sprintf(local_2418,"Added by %s (%s at %d hours)\n\r",pstr,pcVar1,
          ((*(int *)(local_10 + 0x13c) + current_time) - *(long *)(local_10 + 0x148)) / 0xe10 &
          0xffffffff);
  strcat(local_1218,local_2418);
  strcat(local_1218,local_18);
  strcat(local_1218,"\n\r");
  free_pstring(pstr);
  pcVar1 = palloc_string(in_stack_ffffffffffffdbf8);
  *(char **)(*(long *)(local_10 + 0xc0) + 0xb18) = pcVar1;
  return;
}

Assistant:

void add_history(CHAR_DATA *ch, CHAR_DATA *victim, char *string)
{
	char buf[MAX_STRING_LENGTH];
	char obuf[MAX_STRING_LENGTH];
	char *strtime;

	strtime = ctime(&current_time);
	chomp(strtime);

	if (victim->pcdata->history_buffer)
		sprintf(buf, "%s", victim->pcdata->history_buffer);
	else
		strcpy(buf, "");

	sprintf(obuf, "Added by %s (%s at %d hours)\n\r",
		ch ? ch->name : "AUTO",
		strtime,
		(int)((victim->played + current_time - victim->logon) / 3600));

	strcat(buf, obuf);
	strcat(buf, string);
	strcat(buf, "\n\r");

	free_pstring(victim->pcdata->history_buffer);
	victim->pcdata->history_buffer = palloc_string(buf);
}